

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatNotification.cpp
# Opt level: O2

EC_T_DWORD __thiscall
CEmNotification::emRasNotify(CEmNotification *this,EC_T_DWORD dwCode,EC_T_NOTIFYPARMS *pParms)

{
  uint *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  CAtEmLogging *pCVar6;
  uint uVar7;
  
  if (pParms == (EC_T_NOTIFYPARMS *)0x0) {
    return 0x9811000b;
  }
  switch(dwCode) {
  case 0x110001:
    if (0xf < pParms->dwInBufSize) {
      puVar1 = (uint *)pParms->pbyInBuf;
      CAtEmLogging::LogError(this->m_pcLogging,"Marshaling error! Cookie: 0x%lx",(ulong)*puVar1);
      pCVar6 = this->m_pcLogging;
      uVar4 = puVar1[3];
      uVar2 = ecatGetText(puVar1[1]);
      CAtEmLogging::LogError
                (pCVar6,"Command: 0x%lx, Cause: %s (0x%lx)",(ulong)uVar4,uVar2,(ulong)puVar1[1]);
      CAtEmLogging::LogError(this->m_pcLogging,"Protocol Header: 0x%lx",(ulong)puVar1[2]);
      return 0;
    }
    pCVar6 = this->m_pcLogging;
    pcVar5 = "Invalid Parameter size for ATEMRAS_NOTIFY_MARSHALERROR";
    goto LAB_0014ce65;
  case 0x110002:
    pCVar6 = this->m_pcLogging;
    uVar2 = ecatGetText(*(uint *)pParms->pbyInBuf);
    uVar3 = (ulong)*(uint *)pParms->pbyInBuf;
    pcVar5 = "Acknowledge error! Error: %s (0x%lx)";
LAB_0014ceed:
    CAtEmLogging::LogError(pCVar6,pcVar5,uVar2,uVar3);
    return 0;
  case 0x110003:
    uVar4 = *(uint *)pParms->pbyInBuf;
    uVar7 = *(uint *)((long)pParms->pbyInBuf + 4);
    pCVar6 = this->m_pcLogging;
    uVar2 = ecatGetNotifyText(uVar7);
    pcVar5 = "Out of notification memory! %s (0x%08X), cookie 0x%lx.\n";
    break;
  case 0x110004:
    uVar4 = *(uint *)pParms->pbyInBuf;
    uVar7 = *(uint *)((long)pParms->pbyInBuf + 4);
    pCVar6 = this->m_pcLogging;
    uVar2 = ecatGetNotifyText(uVar7);
    pcVar5 = "Out of non-mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n";
    break;
  case 0x110005:
    uVar4 = *(uint *)pParms->pbyInBuf;
    uVar7 = *(uint *)((long)pParms->pbyInBuf + 4);
    pCVar6 = this->m_pcLogging;
    uVar2 = ecatGetNotifyText(uVar7);
    pcVar5 = "Out of mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n";
    break;
  default:
    if (dwCode == 0x100003) {
      if (0xf < pParms->dwInBufSize) {
        return 0;
      }
      pCVar6 = this->m_pcLogging;
      pcVar5 = "RAS Invalid Parameter size for ATEMRAS_NOTIFY_UNREGISTER";
    }
    else if (dwCode == 0x100002) {
      if (0xf < pParms->dwInBufSize) {
        return 0;
      }
      pCVar6 = this->m_pcLogging;
      pcVar5 = "RAS Invalid Parameter size for ATEMRAS_NOTIFY_REGISTER\n";
    }
    else {
      if (dwCode != 0x100001) {
        pCVar6 = this->m_pcLogging;
        uVar2 = ecatGetNotifyText(dwCode);
        pcVar5 = "emRasNotify: name = %s code = 0x%x";
        uVar3 = (ulong)dwCode;
        goto LAB_0014ceed;
      }
      if (7 < pParms->dwInBufSize) {
        puVar1 = (uint *)pParms->pbyInBuf;
        uVar4 = *puVar1;
        pCVar6 = this->m_pcLogging;
        if (uVar4 == 0) {
          CAtEmLogging::LogMsg(pCVar6,"RAS Connection changed: Established!\n");
          this->m_bRasServerDisconnect = 0;
          return 0;
        }
        uVar2 = ecatGetText(uVar4);
        CAtEmLogging::LogMsg
                  (pCVar6,"RAS Connection changed: Cause: %s (0x%lx)\n",uVar2,(ulong)*puVar1);
        this->m_bRasServerDisconnect = 1;
        return 0;
      }
      pCVar6 = this->m_pcLogging;
      pcVar5 = "RAS Invalid Parameter size for ATEMRAS_NOTIFY_CONNECTION";
    }
LAB_0014ce65:
    CAtEmLogging::LogError(pCVar6,pcVar5);
    return 0x9811000b;
  }
  CAtEmLogging::LogError(pCVar6,pcVar5,uVar2,(ulong)uVar7,(ulong)uVar4);
  return 0;
}

Assistant:

EC_T_DWORD CEmNotification::emRasNotify(
    EC_T_DWORD          dwCode,     /**< [in]   Notification code identifier */
    EC_T_NOTIFYPARMS*   pParms      /**< [in]   Notification data portion */
                                       )
{
    EC_T_DWORD dwRetVal = EC_E_ERROR;

    if ((EC_NULL == pParms))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }

    switch (dwCode)
    {
    case ATEMRAS_NOTIFY_CONNECTION:         /* GENERIC RAS | 1 */
        {
            ATEMRAS_PT_CONNOTIFYDESC    pConNot = EC_NULL;
            if (sizeof(ATEMRAS_T_CONNOTIFYDESC) > pParms->dwInBufSize)
            {
                LogError("RAS Invalid Parameter size for ATEMRAS_NOTIFY_CONNECTION");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

            pConNot = (ATEMRAS_PT_CONNOTIFYDESC)pParms->pbyInBuf;

            if (pConNot->dwCause == EC_E_NOERROR)
            {
                LogMsg("RAS Connection changed: Established!\n");
                m_bRasServerDisconnect = EC_FALSE;
            }
            else
            {
                LogMsg("RAS Connection changed: Cause: %s (0x%lx)\n",
                    ((EMRAS_E_ERROR == (pConNot->dwCause&EMRAS_E_ERROR))?ecatGetText(pConNot->dwCause):ecatGetText(pConNot->dwCause)), pConNot->dwCause);
                m_bRasServerDisconnect = EC_TRUE;
            }
        } break;
    case ATEMRAS_NOTIFY_REGISTER:           /* GENERIC RAS | 2 */
        {
            /* ATEMRAS_PT_REGNOTIFYDESC pReg = EC_NULL; */

            if (sizeof(ATEMRAS_T_REGNOTIFYDESC) > pParms->dwInBufSize)
            {
                LogError("RAS Invalid Parameter size for ATEMRAS_NOTIFY_REGISTER\n");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

/*
            pReg = (ATEMRAS_PT_REGNOTIFYDESC) pParms->pbyInBuf;
            LogMsg("Client registered from cookie 0x%lx Instance 0x%lx Id 0x%lx Result %s (0x%lx)",
                pReg->dwCookie, pReg->dwInstanceId, pReg->dwClientId,
                ((EMRAS_E_ERROR == (pReg->dwResult&EMRAS_E_ERROR))?ecatGetText(EC_LOWORD(pReg->dwResult)):ecatGetText(EC_LOWORD(pReg->dwResult))),
                pReg->dwResult);
*/
        } break;
    case ATEMRAS_NOTIFY_UNREGISTER:         /* GENERIC RAS | 3 */
        {
            /* ATEMRAS_PT_REGNOTIFYDESC pReg = EC_NULL; */

            if (sizeof(ATEMRAS_T_REGNOTIFYDESC) > pParms->dwInBufSize)
            {
                LogError("RAS Invalid Parameter size for ATEMRAS_NOTIFY_UNREGISTER");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

/*
            pReg = (ATEMRAS_PT_REGNOTIFYDESC) pParms->pbyInBuf;
            LogMsg("Client un-registered from cookie 0x%lx Instance 0x%lx Id 0x%lx Result %s (0x%lx)",
                pReg->dwCookie, pReg->dwInstanceId, pReg->dwClientId,
                ((EMRAS_E_ERROR == (pReg->dwResult&EMRAS_E_ERROR))?ecatGetText(EC_LOWORD(pReg->dwResult)):ecatGetText(EC_LOWORD(pReg->dwResult))),
                pReg->dwResult);
*/
        } break;
    case ATEMRAS_NOTIFY_MARSHALERROR:       /* ERROR RAS | 1 */
        {
            ATEMRAS_PT_MARSHALERRORDESC     pMarshNot = EC_NULL;
            if (sizeof(ATEMRAS_T_MARSHALERRORDESC) > pParms->dwInBufSize)
            {
                LogError("Invalid Parameter size for ATEMRAS_NOTIFY_MARSHALERROR");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

            pMarshNot = (ATEMRAS_PT_MARSHALERRORDESC)pParms->pbyInBuf;
            LogError("Marshaling error! Cookie: 0x%lx", pMarshNot->dwCookie);
            LogError("Command: 0x%lx, Cause: %s (0x%lx)",
                pMarshNot->dwCommandCode,
                ((EMRAS_E_ERROR == (pMarshNot->dwCause&EMRAS_E_ERROR))?ecatGetText(pMarshNot->dwCause):ecatGetText(pMarshNot->dwCause)),
                pMarshNot->dwCause);
            LogError("Protocol Header: 0x%lx", pMarshNot->dwLenStatCmd);
        } break;
    case ATEMRAS_NOTIFY_ACKERROR:           /* ERROR RAS | 2 */
        {
            LogError("Acknowledge error! Error: %s (0x%lx)", ecatGetText(EC_GETDWORD(pParms->pbyInBuf)), EC_GETDWORD(pParms->pbyInBuf));
        } break;
    case ATEMRAS_NOTIFY_NONOTIFYMEMORY:     /* ERROR RAS | 3 */
        {
            ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc;
            ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized = (ATEMRAS_PT_NONOTIFYMEMORYDESC)pParms->pbyInBuf;
            OsDbgAssert(pParms->dwInBufSize >= sizeof(ATEMRAS_T_NONOTIFYMEMORYDESC));
            NoNotifyMemoryDesc.dwCookie = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCookie);
            NoNotifyMemoryDesc.dwCode = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCode);

            LogError("Out of notification memory! %s (0x%08X), cookie 0x%lx.\n",
                ecatGetNotifyText(NoNotifyMemoryDesc.dwCode), NoNotifyMemoryDesc.dwCode, NoNotifyMemoryDesc.dwCookie);
        } break;
    case ATEMRAS_NOTIFY_STDNOTIFYMEMORYSMALL:   /* ERROR RAS | 4 */
        {
            ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc;
            ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized = (ATEMRAS_PT_NONOTIFYMEMORYDESC)pParms->pbyInBuf;
            OsDbgAssert(pParms->dwInBufSize >= sizeof(ATEMRAS_T_NONOTIFYMEMORYDESC));
            NoNotifyMemoryDesc.dwCookie = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCookie);
            NoNotifyMemoryDesc.dwCode = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCode);

            LogError("Out of non-mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n",
                ecatGetNotifyText(NoNotifyMemoryDesc.dwCode), NoNotifyMemoryDesc.dwCode, NoNotifyMemoryDesc.dwCookie);
        } break;
    case ATEMRAS_NOTIFY_MBXNOTIFYMEMORYSMALL:   /* ERROR RAS | 5 */
        {
            ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc;
            ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized = (ATEMRAS_PT_NONOTIFYMEMORYDESC)pParms->pbyInBuf;
            OsDbgAssert(pParms->dwInBufSize >= sizeof(ATEMRAS_T_NONOTIFYMEMORYDESC));
            NoNotifyMemoryDesc.dwCookie = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCookie);
            NoNotifyMemoryDesc.dwCode = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCode);

            LogError("Out of mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n",
                ecatGetNotifyText(NoNotifyMemoryDesc.dwCode), NoNotifyMemoryDesc.dwCode, NoNotifyMemoryDesc.dwCookie);
        } break;
    default:
        {
            LogError("emRasNotify: name = %s code = 0x%x", ecatGetNotifyText(dwCode), dwCode);
        } break;
    }

    dwRetVal = EC_E_NOERROR;
Exit:
    return dwRetVal;
}